

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

String * __thiscall
doctest::detail::stringifyBinaryExpr<cfgfile::file_format_t,cfgfile::file_format_t>
          (String *__return_storage_ptr__,detail *this,file_format_t *lhs,char *op,
          file_format_t *rhs)

{
  char buf [64];
  String SStack_c8;
  String local_b0;
  String local_98;
  String local_80;
  char local_68 [72];
  
  sprintf(local_68,"%d",(ulong)*(uint *)this);
  String::String(&local_98,local_68);
  String::String(&local_b0,(char *)lhs);
  operator+(&local_80,&local_98,&local_b0);
  sprintf(local_68,"%d",(ulong)*(uint *)op);
  String::String(&SStack_c8,local_68);
  operator+(__return_storage_ptr__,&local_80,&SStack_c8);
  String::~String(&SStack_c8);
  String::~String(&local_80);
  String::~String(&local_b0);
  String::~String(&local_98);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }